

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_string_parser.c
# Opt level: O0

int connectionstringparser_splitHostName
              (STRING_HANDLE hostNameString,STRING_HANDLE nameString,STRING_HANDLE suffixString)

{
  char *hostName;
  undefined4 local_24;
  int result;
  STRING_HANDLE suffixString_local;
  STRING_HANDLE nameString_local;
  STRING_HANDLE hostNameString_local;
  
  if (hostNameString == (STRING_HANDLE)0x0) {
    local_24 = 0xe1;
  }
  else {
    hostName = STRING_c_str(hostNameString);
    local_24 = connectionstringparser_splitHostName_from_char(hostName,nameString,suffixString);
  }
  return local_24;
}

Assistant:

int connectionstringparser_splitHostName(STRING_HANDLE hostNameString, STRING_HANDLE nameString, STRING_HANDLE suffixString)
{
    int result;

    if (hostNameString == NULL)
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_034: [If the hostNameString is NULL, connectionstringparser_splitHostName shall return MU_FAILURE.]*/
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_033: [connectionstringparser_splitHostName shall convert the hostNameString to a connection_string passed in as argument, and call connectionstringparser_splitHostName_from_char.]*/
        result = connectionstringparser_splitHostName_from_char(STRING_c_str(hostNameString), nameString, suffixString);
    }

    return result;
}